

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_auto_extension(_func_void *xInit)

{
  _func_void **pp_Var1;
  _func_void *in_RDI;
  _func_void **aNew;
  u64 nByte;
  sqlite3_mutex *mutex;
  u32 i;
  int rc;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint local_18;
  int local_14;
  int local_4;
  
  local_14 = sqlite3_initialize();
  local_4 = local_14;
  if (local_14 == 0) {
    sqlite3MutexAlloc(in_stack_ffffffffffffffcc);
    sqlite3_mutex_enter((sqlite3_mutex *)0x145d93);
    for (local_18 = 0; (local_18 < sqlite3Autoext.nExt && (sqlite3Autoext.aExt[local_18] != in_RDI))
        ; local_18 = local_18 + 1) {
    }
    if (local_18 == sqlite3Autoext.nExt) {
      pp_Var1 = (_func_void **)
                sqlite3_realloc64((void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8),0x145e0e);
      if (pp_Var1 == (_func_void **)0x0) {
        local_14 = 7;
      }
      else {
        sqlite3Autoext.aExt = pp_Var1;
        pp_Var1[sqlite3Autoext.nExt] = in_RDI;
        sqlite3Autoext.nExt = sqlite3Autoext.nExt + 1;
      }
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x145e62);
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_auto_extension(
  void (*xInit)(void)
){
  int rc = SQLITE_OK;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( xInit==0 ) return SQLITE_MISUSE_BKPT;
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ){
    return rc;
  }else
#endif
  {
    u32 i;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
    wsdAutoextInit;
    sqlite3_mutex_enter(mutex);
    for(i=0; i<wsdAutoext.nExt; i++){
      if( wsdAutoext.aExt[i]==xInit ) break;
    }
    if( i==wsdAutoext.nExt ){
      u64 nByte = (wsdAutoext.nExt+1)*sizeof(wsdAutoext.aExt[0]);
      void (**aNew)(void);
      aNew = sqlite3_realloc64(wsdAutoext.aExt, nByte);
      if( aNew==0 ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        wsdAutoext.aExt = aNew;
        wsdAutoext.aExt[wsdAutoext.nExt] = xInit;
        wsdAutoext.nExt++;
      }
    }
    sqlite3_mutex_leave(mutex);
    assert( (rc&0xff)==rc );
    return rc;
  }
}